

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

string * __thiscall
filesystem::path::str_abi_cxx11_(string *__return_storage_ptr__,path *this,path_type type)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  string *psVar4;
  pointer pbVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar17 [64];
  ostringstream oss;
  char local_1b1;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (this->m_absolute == true) {
    if (this->m_type == native_path) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/",1);
    }
    else {
      pbVar5 = (this->m_path).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)(this->m_path).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
      if (lVar9 == 0) {
        uVar7 = 0;
      }
      else {
        auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar12 = vpbroadcastq_avx512f(ZEXT816(8));
        lVar9 = lVar9 >> 5;
        auVar17 = ZEXT1664((undefined1  [16])0x0);
        auVar13 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
        uVar7 = lVar9 + (ulong)(lVar9 == 0) + 7 & 0xfffffffffffffff8;
        auVar14 = vpbroadcastq_avx512f();
        do {
          uVar6 = vpcmpuq_avx512f(auVar11,auVar14,2);
          auVar15 = vmovdqa64_avx512f(auVar17);
          vpsllq_avx512f(auVar11,5);
          auVar11 = vpaddq_avx512f(auVar11,auVar12);
          uVar7 = uVar7 - 8;
          auVar17 = vpgatherqq_avx512f(*(undefined8 *)
                                        ((long)&pbVar5->_M_string_length + (ulong)type));
          auVar16._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar17._8_8_;
          auVar16._0_8_ = (ulong)((byte)uVar6 & 1) * auVar17._0_8_;
          auVar16._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar17._16_8_;
          auVar16._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar17._24_8_;
          auVar16._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar17._32_8_;
          auVar16._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar17._40_8_;
          auVar16._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar17._48_8_;
          auVar16._56_8_ = (uVar6 >> 7) * auVar17._56_8_;
          auVar17 = vpaddq_avx512f(auVar15,auVar16);
          auVar17 = vpsubq_avx512f(auVar17,auVar13);
        } while (uVar7 != 0);
        auVar11 = vmovdqa64_avx512f(auVar17);
        bVar1 = (bool)((byte)uVar6 & 1);
        auVar12._0_8_ = (ulong)bVar1 * auVar11._0_8_ | (ulong)!bVar1 * auVar15._0_8_;
        bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar12._8_8_ = (ulong)bVar1 * auVar11._8_8_ | (ulong)!bVar1 * auVar15._8_8_;
        bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar12._16_8_ = (ulong)bVar1 * auVar11._16_8_ | (ulong)!bVar1 * auVar15._16_8_;
        bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar12._24_8_ = (ulong)bVar1 * auVar11._24_8_ | (ulong)!bVar1 * auVar15._24_8_;
        bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar12._32_8_ = (ulong)bVar1 * auVar11._32_8_ | (ulong)!bVar1 * auVar15._32_8_;
        bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar12._40_8_ = (ulong)bVar1 * auVar11._40_8_ | (ulong)!bVar1 * auVar15._40_8_;
        bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar12._48_8_ = (ulong)bVar1 * auVar11._48_8_ | (ulong)!bVar1 * auVar15._48_8_;
        auVar12._56_8_ =
             (uVar6 >> 7) * auVar11._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar15._56_8_;
        auVar10 = vextracti64x4_avx512f(auVar12,1);
        auVar11 = vpaddq_avx512f(auVar12,ZEXT3264(auVar10));
        auVar2 = vpaddq_avx(auVar11._0_16_,auVar11._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpaddq_avx(auVar2,auVar3);
        uVar7 = auVar2._0_8_;
      }
      bVar1 = this->m_smb;
      uVar6 = uVar7 + 2;
      if (bVar1 == false) {
        uVar6 = uVar7;
      }
      if (uVar6 < 0x105) {
        if (bVar1 == false) goto LAB_004897e7;
        lVar9 = 2;
        pcVar8 = "\\\\";
      }
      else {
        pcVar8 = "\\\\?\\";
        if (bVar1 != false) {
          pcVar8 = "\\\\?\\UNC\\";
        }
        lVar9 = (ulong)bVar1 * 4 + 4;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar9);
    }
  }
LAB_004897e7:
  pbVar5 = (this->m_path).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = __return_storage_ptr__;
  if ((this->m_path).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    lVar9 = 8;
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)((long)pbVar5 + lVar9 + -8),
                 *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar9));
      uVar7 = uVar7 + 1;
      if (uVar7 < (ulong)((long)(this->m_path).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_path).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        if (type == native_path) {
          local_1b1 = '/';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
        }
        else {
          local_1b1 = '\\';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
        }
      }
      pbVar5 = (this->m_path).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x20;
    } while (uVar7 < (ulong)((long)(this->m_path).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5));
  }
  psVar4 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string str(path_type type = native_path) const {
        std::ostringstream oss;

        if (m_absolute) {
            if (m_type == posix_path)
                oss << "/";
            else {
                size_t length = 0;
                for (size_t i = 0; i < m_path.size(); ++i)
                    // No special case for the last segment to count the NULL character
                    length += m_path[i].length() + 1;
                if (m_smb)
                    length += 2;

                // Windows requires a \\?\ prefix to handle paths longer than MAX_PATH
                // (including their null character). NOTE: relative paths >MAX_PATH are
                // not supported at all in Windows.
                if (length > MAX_PATH_WINDOWS_LEGACY) {
                    if (m_smb)
                        oss << "\\\\?\\UNC\\";
                    else
                        oss << "\\\\?\\";
                } else if (m_smb)
                    oss << "\\\\";
            }
        }

        for (size_t i=0; i<m_path.size(); ++i) {
            oss << m_path[i];
            if (i+1 < m_path.size()) {
                if (type == posix_path)
                    oss << '/';
                else
                    oss << '\\';
            }
        }

        return oss.str();
    }